

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O1

int Ivy_ManSetLevels_rec(Ivy_Obj_t *pObj,int fHaig)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Ivy_Obj_t *pIVar5;
  
  uVar3 = *(uint *)&pObj->field_0x8;
  if ((uVar3 & 0x10) == 0) {
    *(uint *)&pObj->field_0x8 = uVar3 | 0x10;
    uVar1 = 0;
    if (pObj->Id != 0) {
      uVar3 = uVar3 & 0xf;
      if (uVar3 - 5 < 3) {
        Ivy_ManSetLevels_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),fHaig);
        if ((*(uint *)&pObj->field_0x8 & 0xf) != 7) {
          Ivy_ManSetLevels_rec((Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),fHaig);
        }
        uVar3 = *(uint *)&pObj->field_0x8;
        uVar1 = uVar3 & 0xf;
        if (uVar1 == 7) {
          uVar1 = (*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 8) & 0xfffff800) + 0x800;
          uVar4 = 0x7f7;
        }
        else {
          if (uVar1 - 7 < 0xfffffffe) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDfs.c"
                          ,0x1ab,"int Ivy_ManSetLevels_rec(Ivy_Obj_t *, int)");
          }
          iVar2 = Ivy_ObjLevelNew(pObj);
          uVar1 = iVar2 << 0xb;
          uVar4 = 0x7ff;
        }
        *(uint *)&pObj->field_0x8 = uVar3 & uVar4 | uVar1;
        if (((fHaig != 0) && (pIVar5 = pObj->pEquiv, pIVar5 != (Ivy_Obj_t *)0x0)) &&
           (0 < pObj->nRefs)) {
          uVar3 = *(uint *)&pObj->field_0x8 >> 0xb;
          for (; pIVar5 != pObj; pIVar5 = (Ivy_Obj_t *)((ulong)pIVar5->pEquiv & 0xfffffffffffffffe))
          {
            Ivy_ManSetLevels_rec(pIVar5,fHaig);
            uVar1 = *(uint *)&pIVar5->field_0x8 >> 0xb;
            if (uVar3 <= uVar1) {
              uVar3 = uVar1;
            }
          }
          *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 0x7ff | uVar3 << 0xb;
          for (pIVar5 = pObj->pEquiv; pIVar5 != pObj;
              pIVar5 = (Ivy_Obj_t *)((ulong)pIVar5->pEquiv & 0xfffffffffffffffe)) {
            *(uint *)&pIVar5->field_0x8 = *(uint *)&pIVar5->field_0x8 & 0x7ff | uVar3 << 0xb;
          }
        }
        uVar1 = *(uint *)&pObj->field_0x8 >> 0xb;
      }
      else if ((uVar3 != 1) && (uVar1 = 0, uVar3 != 4)) {
        __assert_fail("Ivy_ObjIsBuf(pObj) || Ivy_ObjIsAnd(pObj) || Ivy_ObjIsExor(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyDfs.c"
                      ,0x1a1,"int Ivy_ManSetLevels_rec(Ivy_Obj_t *, int)");
      }
    }
  }
  else {
    uVar1 = uVar3 >> 0xb;
  }
  return uVar1;
}

Assistant:

int Ivy_ManSetLevels_rec( Ivy_Obj_t * pObj, int fHaig )
{
    // quit if the node is visited
    if ( Ivy_ObjIsMarkA(pObj) )
        return pObj->Level;
    Ivy_ObjSetMarkA(pObj);
    // quit if this is a CI
    if ( Ivy_ObjIsConst1(pObj) || Ivy_ObjIsCi(pObj) )
        return 0;
    assert( Ivy_ObjIsBuf(pObj) || Ivy_ObjIsAnd(pObj) || Ivy_ObjIsExor(pObj) );
    // get levels of the fanins
    Ivy_ManSetLevels_rec( Ivy_ObjFanin0(pObj), fHaig );
    if ( !Ivy_ObjIsBuf(pObj) )
        Ivy_ManSetLevels_rec( Ivy_ObjFanin1(pObj), fHaig );
    // get level of the node
    if ( Ivy_ObjIsBuf(pObj) )
        pObj->Level = 1 + Ivy_ObjFanin0(pObj)->Level;
    else if ( Ivy_ObjIsNode(pObj) )
        pObj->Level = Ivy_ObjLevelNew( pObj );
    else assert( 0 );
    // get level of other choices
    if ( fHaig && pObj->pEquiv && Ivy_ObjRefs(pObj) > 0 )
    {
        Ivy_Obj_t * pTemp;
        unsigned LevelMax = pObj->Level;
        for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
        {
            Ivy_ManSetLevels_rec( pTemp, fHaig );
            LevelMax = IVY_MAX( LevelMax, pTemp->Level );
        }
        // get this level
        pObj->Level = LevelMax;
        for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
            pTemp->Level = LevelMax;
    }
    return pObj->Level;
}